

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O3

printable_vtable * __thiscall
printable_vtable::operator=(printable_vtable *this,large_printable *value)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  _func_void *p_Var4;
  void *pvVar5;
  printable_vtable local_78;
  printable_vtable local_48;
  
  pdVar1 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_78.vtable_._M_elems[2] = print_wrapper<large_printable>::exec;
  local_78.vtable_._M_elems[0] = clone_impl<large_printable>;
  local_78.vtable_._M_elems[1] = delete_impl<large_printable>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  local_78.value_ = malloc(0x2018);
  *(pointer *)local_78.value_ = pdVar2;
  *(pointer *)((long)local_78.value_ + 8) = pdVar3;
  *(pointer *)((long)local_78.value_ + 0x10) = pdVar1;
  local_48.vtable_._M_elems[2] = print_wrapper<large_printable>::exec;
  local_48.vtable_._M_elems[0] = clone_impl<large_printable>;
  local_48.vtable_._M_elems[1] = delete_impl<large_printable>;
  local_48.get_value_ptr_ = get_value_ptr<true>;
  local_78.get_value_ptr_ = get_value_ptr<false>;
  local_48.value_ = local_78.value_;
  operator=(&local_78,this);
  operator=(this,&local_48);
  p_Var4 = local_48.vtable_._M_elems[1];
  if (local_48.get_value_ptr_ == get_value_ptr<true>) {
    pvVar5 = get_value_ptr<true>(&local_48);
    (*p_Var4)(pvVar5);
  }
  p_Var4 = local_78.vtable_._M_elems[1];
  if (local_78.get_value_ptr_ == get_value_ptr<true>) {
    pvVar5 = get_value_ptr<true>(&local_78);
    (*p_Var4)(pvVar5);
  }
  return this;
}

Assistant:

printable_vtable & operator= (T value)
    {
        printable_vtable temp(std::move(value));
        std::swap(temp, *this);
        return *this;
    }